

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DRender.cpp
# Opt level: O3

void distributed_render_scene
               (Scene *scene,double half_width,double half_height,int nx,int ny,int nx_sub,
               int ny_sub,char *fname)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  TargaImage *this;
  int iVar7;
  int iVar8;
  ushort uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double y1;
  Ray ray;
  double local_160;
  double local_150;
  double local_138;
  double dStack_130;
  double local_128;
  Color local_78;
  Ray local_60;
  
  this = (TargaImage *)operator_new(0x40);
  TargaImage::TargaImage(this,fname,nx,ny,(char *)0x0);
  if (0 < ny) {
    dVar13 = (half_width + half_width) / (double)nx;
    dVar14 = (half_height + half_height) / (double)ny;
    dVar10 = (double)(ny_sub * nx_sub);
    iVar3 = 0;
    local_160 = half_height;
    do {
      if (0 < nx) {
        iVar4 = 0;
        local_150 = -half_width;
        do {
          TotalPixels = TotalPixels + 1;
          if (nx_sub < 1) {
            local_138 = 0.0;
            dStack_130 = 0.0;
            local_128 = 0.0;
          }
          else {
            local_138 = 0.0;
            dStack_130 = 0.0;
            local_128 = 0.0;
            iVar8 = 0;
            do {
              if (0 < ny_sub) {
                iVar7 = 0;
                do {
                  iVar5 = rand();
                  iVar6 = rand();
                  Scene::camera(scene,((double)iVar5 / 2147483647.0 + (double)iVar8) *
                                      (dVar13 / (double)nx_sub) + dVar13 * -0.5 + local_150,
                                ((double)iVar6 / 2147483647.0 + (double)iVar7) *
                                (dVar14 / (double)ny_sub) + dVar14 * -0.5 + local_160,&local_60);
                  Scene::trace(&local_78,scene,&Grayzer::Medium::air,1.0,&local_60);
                  local_138 = local_138 + local_78.x;
                  dStack_130 = dStack_130 + local_78.y;
                  local_128 = local_128 + local_78.z;
                  iVar7 = iVar7 + 1;
                } while (ny_sub != iVar7);
              }
              iVar8 = iVar8 + 1;
            } while (iVar8 != nx_sub);
          }
          auVar11._8_8_ = dStack_130;
          auVar11._0_8_ = local_128;
          auVar12._8_8_ = dVar10;
          auVar12._0_8_ = dVar10;
          auVar12 = divpd(auVar11,auVar12);
          iVar8 = (int)(auVar12._0_8_ * 255.0);
          iVar7 = (int)(auVar12._8_8_ * 255.0);
          sVar1 = (short)iVar8;
          sVar2 = (short)((uint)iVar8 >> 0x10);
          uVar9 = CONCAT11((0 < sVar2) * (sVar2 < 0x100) * (char)((uint)iVar8 >> 0x10) -
                           (0xff < sVar2),
                           (0 < sVar1) * (sVar1 < 0x100) * (char)iVar8 - (0xff < sVar1));
          sVar1 = (short)iVar7;
          sVar2 = (short)((uint)iVar7 >> 0x10);
          (*(this->super_Image)._vptr_Image[3])
                    (this,(ulong)((int)((local_138 / dVar10) * 255.0) & 0xffU |
                                 (CONCAT13((0 < sVar2) * (sVar2 < 0x100) *
                                           (char)((uint)iVar7 >> 0x10) - (0xff < sVar2),
                                           CONCAT12((0 < sVar1) * (sVar1 < 0x100) * (char)iVar7 -
                                                    (0xff < sVar1),uVar9)) >> 0x10) << 8 |
                                 (uint)uVar9 << 0x10));
          iVar4 = iVar4 + 1;
          local_150 = local_150 + dVar13;
        } while (iVar4 != nx);
      }
      iVar3 = iVar3 + 1;
      local_160 = local_160 - dVar14;
    } while (iVar3 != ny);
  }
  (*(this->super_Image)._vptr_Image[1])();
  return;
}

Assistant:

void distributed_render_scene(
   Scene* scene,
   double half_width, double half_height,
   int   nx,   int   ny,
   int   nx_sub,  int   ny_sub,
   char const* fname )
{
   double x,y;                // sample point
   Ray   ray;                 // pixel ray
   double hx = 2.0   * half_width / nx;      // pixel width
   double hy = 2.0   * half_height /   ny;      // pixel height
   double hx_sub =   hx / nx_sub;         // hz subdivision
   double hy_sub =   hy / ny_sub;         // vt subdivision
   int   i,j;
   int   primary_samples   = nx_sub * ny_sub; // # of samples for each  pixel
   Vector color;

   // make  next in  some higher-level module as: RenderOutFile = new Targa...
   auto tga = std::make_unique<TargaImage>( fname,nx,ny );
   rgb   c;

   for( i = 0, y =   half_height; i < ny; i++, y   -= hy )
   {
      for( j = 0, x =   -half_width; j < nx; j++, x   += hx )
      {
         double x1 = x -   0.5   * hx;
         double y1 = y -   0.5   * hy;
         color =  0;

         TotalPixels++;

         for( int iSub =   0; iSub  < nx_sub; iSub++ )
            for( int jSub =   0; jSub  < ny_sub; jSub++ )
            {
               scene->camera(x1 + hx_sub * (iSub + rnd()),
                     y1 +  hy_sub * (jSub + rnd()), ray );
               color += scene->trace(Grayzer::Medium::air, 1.0, ray);
            }
         color /= primary_samples;
         clip(color);

         c.r   = color.x * 255;
         c.g   = color.y * 255;
         c.b   = color.z * 255;

         tga->put_pixel(c);
      }
   }
}